

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationBuilder::addIfDifferent
          (CollationBuilder *this,UnicodeString *prefix,UnicodeString *str,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t ces2Length;
  int32_t oldCEsLength;
  int64_t oldCEs [31];
  uint32_t local_38;
  uint32_t ce32_local;
  int32_t newCEsLength_local;
  int64_t *newCEs_local;
  UnicodeString *str_local;
  UnicodeString *prefix_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  this_local._4_4_ = ce32;
  if (UVar1 == '\0') {
    ces2Length = CollationDataBuilder::getCEs
                           (this->dataBuilder,prefix,str,(int64_t *)&stack0xfffffffffffffec8,0);
    UVar1 = sameCEs(newCEs,newCEsLength,(int64_t *)&stack0xfffffffffffffec8,ces2Length);
    local_38 = ce32;
    if (UVar1 == '\0') {
      if (ce32 == 0xffffffff) {
        local_38 = (*(this->dataBuilder->super_UObject)._vptr_UObject[4])
                             (this->dataBuilder,newCEs,(ulong)(uint)newCEsLength,errorCode);
      }
      CollationDataBuilder::addCE32(this->dataBuilder,prefix,str,local_38,errorCode);
    }
    this_local._4_4_ = local_38;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationBuilder::addIfDifferent(const UnicodeString &prefix, const UnicodeString &str,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }
    int64_t oldCEs[Collation::MAX_EXPANSION_LENGTH];
    int32_t oldCEsLength = dataBuilder->getCEs(prefix, str, oldCEs, 0);
    if(!sameCEs(newCEs, newCEsLength, oldCEs, oldCEsLength)) {
        if(ce32 == Collation::UNASSIGNED_CE32) {
            ce32 = dataBuilder->encodeCEs(newCEs, newCEsLength, errorCode);
        }
        dataBuilder->addCE32(prefix, str, ce32, errorCode);
    }
    return ce32;
}